

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_string.cpp
# Opt level: O2

sc_string_old __thiscall sc_dt::sc_string_old::operator+(sc_string_old *this,char c)

{
  int iVar1;
  sc_string_rep *this_00;
  char in_DL;
  undefined7 in_register_00000031;
  
  iVar1 = length((sc_string_old *)CONCAT71(in_register_00000031,c));
  this_00 = (sc_string_rep *)operator_new(0x10);
  sc_string_rep::sc_string_rep(this_00,iVar1 + 2);
  strcpy(this_00->str,((sc_string_old *)CONCAT71(in_register_00000031,c))->rep->str);
  this_00->str[iVar1] = in_DL;
  this_00->str[(long)iVar1 + 1] = '\0';
  sc_string_old(this,this_00);
  return (sc_string_old)(sc_string_rep *)this;
}

Assistant:

sc_string_old sc_string_old::operator+(char c) const
{
    int len = length();
    sc_string_rep* r = new sc_string_rep( len + 2 );
    strcpy( r->str, rep->str );
    r->str[len] = c;
    r->str[len+1] = 00;
    return sc_string_old(r);
}